

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void QPDFObjectHandle::parseContentStream
               (QPDFObjectHandle *stream_or_array,ParserCallbacks *callbacks)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"content stream objects",&local_39);
  parseContentStream_internal(stream_or_array,&local_38,callbacks);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::parseContentStream(QPDFObjectHandle stream_or_array, ParserCallbacks* callbacks)
{
    stream_or_array.parseContentStream_internal("content stream objects", callbacks);
}